

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O0

void __thiscall Assimp::FBXExporter::WriteDocuments(FBXExporter *this)

{
  shared_ptr<Assimp::IOStream> local_368;
  allocator local_351;
  string local_350;
  allocator local_329;
  string local_328;
  allocator local_301;
  string local_300;
  allocator local_2d9;
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  allocator local_289;
  string local_288;
  allocator local_261;
  string local_260;
  allocator local_239;
  string local_238;
  undefined1 local_218 [8];
  Node p;
  int64_t uid;
  string local_198;
  undefined1 local_178 [8];
  Node doc;
  string local_100;
  allocator local_d9;
  string local_d8;
  undefined1 local_b8 [8];
  Node docs;
  allocator local_31;
  string local_30;
  FBXExporter *local_10;
  FBXExporter *this_local;
  
  local_10 = this;
  if ((this->binary & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_30,"Documents Description",&local_31);
    WriteAsciiSectionHeader(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"Documents",&local_d9);
  FBX::Node::Node((Node *)local_b8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_100,"Count",(allocator *)((long)&doc.property_start + 7));
  FBX::Node::AddChild<int>((Node *)local_b8,&local_100,1);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&doc.property_start + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"Document",(allocator *)((long)&uid + 7));
  FBX::Node::Node((Node *)local_178,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&uid + 7));
  p.property_start = generate_uid(this);
  FBX::Node::AddProperties<long,char_const*,char_const*>
            ((Node *)local_178,p.property_start,"","Scene");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_238,"Properties70",&local_239);
  FBX::Node::Node((Node *)local_218,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_260,"SourceObject",&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_288,"object",&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b0,"",&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d8,"",&local_2d9);
  FBX::Node::AddP70<>((Node *)local_218,&local_260,&local_288,&local_2b0,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_300,"ActiveAnimStackName",&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_328,"",&local_329);
  FBX::Node::AddP70string((Node *)local_218,&local_300,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  FBX::Node::AddChild((Node *)local_178,(Node *)local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_350,"RootNode",&local_351);
  FBX::Node::AddChild<long>((Node *)local_178,&local_350,0);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  FBX::Node::AddChild((Node *)local_b8,(Node *)local_178);
  std::shared_ptr<Assimp::IOStream>::shared_ptr(&local_368,&this->outfile);
  FBX::Node::Dump((Node *)local_b8,&local_368,(bool)(this->binary & 1),0);
  std::shared_ptr<Assimp::IOStream>::~shared_ptr(&local_368);
  FBX::Node::~Node((Node *)local_218);
  FBX::Node::~Node((Node *)local_178);
  FBX::Node::~Node((Node *)local_b8);
  return;
}

Assistant:

void FBXExporter::WriteDocuments ()
{
    if (!binary) {
        WriteAsciiSectionHeader("Documents Description");
    }
    
    // not sure what the use of multiple documents would be,
    // or whether any end-application supports it
    FBX::Node docs("Documents");
    docs.AddChild("Count", int32_t(1));
    FBX::Node doc("Document");

    // generate uid
    int64_t uid = generate_uid();
    doc.AddProperties(uid, "", "Scene");
    FBX::Node p("Properties70");
    p.AddP70("SourceObject", "object", "", ""); // what is this even for?
    p.AddP70string("ActiveAnimStackName", ""); // should do this properly?
    doc.AddChild(p);

    // UID for root node in scene hierarchy.
    // always set to 0 in the case of a single document.
    // not sure what happens if more than one document exists,
    // but that won't matter to us as we're exporting a single scene.
    doc.AddChild("RootNode", int64_t(0));

    docs.AddChild(doc);
    docs.Dump(outfile, binary, 0);
}